

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.cpp
# Opt level: O3

void * MS580314BAThread(void *pParam)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  SOCKET SVar11;
  double dVar12;
  char *pcVar13;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double pressure;
  CHRONO chrono_filter;
  CHRONO chrono_period;
  MS580314BA ms580314ba;
  char szTemp [256];
  char szSaveFilePath [256];
  interval local_8f0;
  double local_8d8;
  int local_8d0;
  int local_8cc;
  timespec local_8c8;
  double local_8b8;
  double dStack_8b0;
  double local_8a8;
  double dStack_8a0;
  timespec local_898;
  int local_888;
  timespec local_880;
  double local_870;
  double dStack_868;
  double local_860;
  double dStack_858;
  timespec local_850;
  int local_840;
  undefined1 local_838 [16];
  timeval local_828;
  double local_810;
  double local_808;
  interval local_800;
  interval local_7e8;
  MS580314BA local_7d0;
  char local_238 [256];
  char local_138 [264];
  
  local_8d8 = 0.0;
  memset(&local_7d0,0,0x598);
  iVar6 = clock_getres(4,&local_898);
  if ((iVar6 == 0) && (iVar6 = clock_gettime(4,&local_8c8), iVar6 == 0)) {
    local_888 = 0;
    local_8b8 = 0.0;
    dStack_8b0 = 0.0;
    local_8a8 = 0.0;
    dStack_8a0 = 0.0;
  }
  iVar6 = clock_getres(4,&local_850);
  if ((iVar6 == 0) && (iVar6 = clock_gettime(4,&local_880), iVar6 == 0)) {
    local_840 = 0;
    local_870 = 0.0;
    dStack_868 = 0.0;
    local_860 = 0.0;
    dStack_858 = 0.0;
  }
  iVar6 = 100;
  local_838 = ZEXT816(0);
  bVar3 = false;
  local_8d0 = 0;
LAB_001bb806:
  iVar9 = iVar6 / 1000;
  iVar8 = iVar6 % 1000;
  bVar3 = !bVar3;
  local_8cc = iVar6;
  while( true ) {
    if (local_840 == 0) {
      clock_gettime(4,(timespec *)&local_8f0);
      local_870 = local_8f0.inf;
      dStack_868 = local_8f0.sup;
      local_8f0.inf =
           (double)((((long)local_8f0.inf + (long)local_860) - local_880.tv_sec) +
                   ((long)local_8f0.sup + (long)dStack_858) / 1000000000);
      local_8f0.sup =
           (double)(((long)local_8f0.sup + (long)dStack_858) % 1000000000 - local_880.tv_nsec);
      if ((long)local_8f0.sup < 0) {
        local_8f0.inf = (double)((long)local_8f0.inf + ~((ulong)-(long)local_8f0.sup / 1000000000));
        local_8f0.sup =
             (double)((long)local_8f0.sup + 1000000000 +
                     ((ulong)-(long)local_8f0.sup / 1000000000) * 1000000000);
      }
      local_860 = local_8f0.inf;
      dStack_858 = local_8f0.sup;
    }
    iVar6 = clock_getres(4,&local_850);
    if ((iVar6 == 0) && (iVar6 = clock_gettime(4,&local_880), iVar6 == 0)) {
      local_840 = 0;
      local_860 = 0.0;
      dStack_858 = 0.0;
      local_870 = 0.0;
      dStack_868 = 0.0;
    }
    local_8f0.inf = (double)(long)iVar9;
    local_8f0.sup = (double)(long)(iVar8 * 1000000);
    nanosleep((timespec *)&local_8f0,(timespec *)0x0);
    iVar6 = local_8cc;
    if (bPauseMS580314BA == 0) break;
    if (!bVar3) {
      puts("MS580314BA Paused.");
      SVar11 = local_7d0.RS232Port.s;
      switch(local_7d0.RS232Port.DevType) {
      case 0:
        SVar11 = (int)local_7d0.RS232Port.hDev;
        goto LAB_001bb9d9;
      case 1:
      case 3:
        break;
      case 2:
        shutdown(local_7d0.RS232Port.s,2);
        close(SVar11);
      case 4:
        SVar11 = local_7d0.RS232Port.s_srv;
        break;
      default:
        goto switchD_001bb9a1_default;
      }
      shutdown(SVar11,2);
LAB_001bb9d9:
      iVar6 = close(SVar11);
      pcVar13 = "MS580314BA disconnected.";
      if (iVar6 != 0) {
switchD_001bb9a1_default:
        pcVar13 = "MS580314BA disconnection failed.";
      }
      puts(pcVar13);
    }
    if (bExit != 0) {
      bVar4 = true;
      goto LAB_001bc24e;
    }
    local_8f0.inf = 0.0;
    local_8f0.sup = 4.94065645841247e-316;
    nanosleep((timespec *)&local_8f0,(timespec *)0x0);
    bVar3 = true;
  }
  if (bRestartMS580314BA == 0) {
    if (bVar3) goto LAB_001bbbac;
    iVar9 = GetPressureMS580314BA(&local_7d0,&local_8d8);
    if (iVar9 != 0) {
      puts("Connection to a MS580314BA lost.");
      SVar11 = local_7d0.RS232Port.s;
      switch(local_7d0.RS232Port.DevType) {
      case 0:
        SVar11 = (int)local_7d0.RS232Port.hDev;
        goto LAB_001bbf71;
      case 1:
      case 3:
        break;
      case 2:
        shutdown(local_7d0.RS232Port.s,2);
        close(SVar11);
      case 4:
        SVar11 = local_7d0.RS232Port.s_srv;
        break;
      default:
        goto switchD_001bbae6_default;
      }
      shutdown(SVar11,2);
LAB_001bbf71:
      iVar9 = close(SVar11);
      pcVar13 = "MS580314BA disconnected.";
      if (iVar9 != 0) {
switchD_001bbae6_default:
        pcVar13 = "MS580314BA disconnection failed.";
      }
      puts(pcVar13);
      goto LAB_001bbbe0;
    }
    iVar9 = gettimeofday(&local_828,(__timezone_ptr_t)0x0);
    if (iVar9 != 0) {
      local_828.tv_sec = 0;
      local_828.tv_usec = 0;
    }
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    pressure_mes = local_8d8;
    dVar12 = local_8a8;
    dVar10 = dStack_8a0;
    if (local_888 == 0) {
      clock_gettime(4,(timespec *)&local_8f0);
      dVar12 = (double)((((long)local_8f0.inf + (long)local_8a8) - local_8c8.tv_sec) +
                       ((long)local_8f0.sup + (long)dStack_8a0) / 1000000000);
      dVar10 = (double)(((long)local_8f0.sup + (long)dStack_8a0) % 1000000000 - local_8c8.tv_nsec);
      if ((long)dVar10 < 0) {
        dVar12 = (double)((long)dVar12 + ~((ulong)-(long)dVar10 / 1000000000));
        dVar10 = (double)((long)dVar10 + 1000000000 +
                         ((ulong)-(long)dVar10 / 1000000000) * 1000000000);
      }
    }
    if (2.0 < (double)(long)dVar10 / 1000000000.0 + (double)(long)dVar12) {
      dVar12 = local_8a8;
      dVar10 = dStack_8a0;
      if (local_888 == 0) {
        clock_gettime(4,(timespec *)&local_8f0);
        dVar12 = (double)((((long)local_8f0.inf + (long)local_8a8) - local_8c8.tv_sec) +
                         ((long)local_8f0.sup + (long)dStack_8a0) / 1000000000);
        dVar10 = (double)(((long)local_8f0.sup + (long)dStack_8a0) % 1000000000 - local_8c8.tv_nsec)
        ;
        if ((long)dVar10 < 0) {
          dVar12 = (double)((long)dVar12 + ~((ulong)-(long)dVar10 / 1000000000));
          dVar10 = (double)((long)dVar10 + 1000000000 +
                           ((ulong)-(long)dVar10 / 1000000000) * 1000000000);
        }
      }
      if ((double)(long)dVar10 / 1000000000.0 + (double)(long)dVar12 <= 3.0) {
        local_838._8_8_ = 0;
        local_838._0_8_ = local_8d8;
      }
    }
    dVar12 = local_8a8;
    dVar10 = dStack_8a0;
    if (local_888 == 0) {
      clock_gettime(4,(timespec *)&local_8f0);
      dVar12 = (double)((((long)local_8f0.inf + (long)local_8a8) - local_8c8.tv_sec) +
                       ((long)local_8f0.sup + (long)dStack_8a0) / 1000000000);
      dVar10 = (double)(((long)local_8f0.sup + (long)dStack_8a0) % 1000000000 - local_8c8.tv_nsec);
      if ((long)dVar10 < 0) {
        dVar12 = (double)((long)dVar12 + ~((ulong)-(long)dVar10 / 1000000000));
        dVar10 = (double)((long)dVar10 + 1000000000 +
                         ((ulong)-(long)dVar10 / 1000000000) * 1000000000);
      }
    }
    dVar15 = local_8d8;
    if (3.0 < (double)(long)dVar10 / 1000000000.0 + (double)(long)dVar12) {
      uVar14 = -(ulong)(ABS(local_8d8 - local_838._0_8_) < 0.05);
      auVar16._0_8_ = (ulong)local_8d8 & uVar14;
      auVar16._8_8_ = 0;
      auVar2._8_4_ = local_838._8_4_;
      auVar2._0_8_ = ~uVar14 & (ulong)local_838._0_8_;
      auVar2._12_4_ = local_838._12_4_;
      local_838 = auVar16 | auVar2;
      dVar15 = local_838._0_8_;
    }
    local_808 = ((dVar15 - local_7d0.PressureRef) * -100000.0) / (local_7d0.WaterDensity * 9.80665);
    interval::interval(&local_7e8,&local_808);
    local_810 = -z_pressure_acc;
    interval::interval(&local_800,&local_810,&z_pressure_acc);
    operator+(&local_7e8,&local_800);
    interval::operator=((interval *)&z_pressure,&local_8f0);
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    if (local_7d0.bSaveRawData != 0) {
      fprintf((FILE *)local_7d0.pfSaveFile,"%d;%d;%f;\n",local_8d8,local_828.tv_sec & 0xffffffff,
              local_828.tv_usec & 0xffffffff);
      goto LAB_001bbe45;
    }
  }
  else {
    if (!bVar3) {
      puts("Restarting a MS580314BA.");
      SVar11 = local_7d0.RS232Port.s;
      switch(local_7d0.RS232Port.DevType) {
      case 0:
        iVar9 = (int)local_7d0.RS232Port.hDev;
        goto LAB_001bbb81;
      case 1:
      case 3:
        iVar9 = local_7d0.RS232Port.s;
        break;
      case 2:
        shutdown(local_7d0.RS232Port.s,2);
        close(SVar11);
      case 4:
        iVar9 = local_7d0.RS232Port.s_srv;
        break;
      default:
        goto switchD_001bba7e_default;
      }
      shutdown(iVar9,2);
LAB_001bbb81:
      iVar9 = close(iVar9);
      pcVar13 = "MS580314BA disconnected.";
      if (iVar9 != 0) {
switchD_001bba7e_default:
        pcVar13 = "MS580314BA disconnection failed.";
      }
      puts(pcVar13);
    }
    bRestartMS580314BA = 0;
LAB_001bbbac:
    iVar8 = ConnectMS580314BA(&local_7d0,"MS580314BA0.txt");
    iVar9 = local_7d0.threadperiod;
    if (iVar8 != 0) {
      local_8f0.inf = 4.94065645841247e-324;
      local_8f0.sup = 0.0;
      nanosleep((timespec *)&local_8f0,(timespec *)0x0);
LAB_001bbbe0:
      local_8d0 = local_8d0 + 1;
      if (ExitOnErrorCount <= local_8d0 && 0 < ExitOnErrorCount) {
        bExit = 1;
        bVar4 = true;
        goto LAB_001bc24e;
      }
      bVar3 = false;
      bVar4 = true;
      goto LAB_001bbe59;
    }
    if (local_888 == 0) {
      clock_gettime(4,(timespec *)&local_8f0);
      local_8b8 = local_8f0.inf;
      dStack_8b0 = local_8f0.sup;
      local_8f0.inf =
           (double)((((long)local_8f0.inf + (long)local_8a8) - local_8c8.tv_sec) +
                   ((long)local_8f0.sup + (long)dStack_8a0) / 1000000000);
      local_8f0.sup =
           (double)(((long)local_8f0.sup + (long)dStack_8a0) % 1000000000 - local_8c8.tv_nsec);
      if ((long)local_8f0.sup < 0) {
        local_8f0.inf = (double)((long)local_8f0.inf + ~((ulong)-(long)local_8f0.sup / 1000000000));
        local_8f0.sup =
             (double)((long)local_8f0.sup + 1000000000 +
                     ((ulong)-(long)local_8f0.sup / 1000000000) * 1000000000);
      }
      local_8a8 = local_8f0.inf;
      dStack_8a0 = local_8f0.sup;
    }
    iVar6 = clock_getres(4,&local_898);
    if ((iVar6 == 0) && (iVar6 = clock_gettime(4,&local_8c8), iVar6 == 0)) {
      local_888 = 0;
      local_8a8 = 0.0;
      dStack_8a0 = 0.0;
      local_8b8 = 0.0;
      dStack_8b0 = 0.0;
    }
    if ((FILE *)local_7d0.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)local_7d0.pfSaveFile);
      local_7d0.pfSaveFile = (FILE *)0x0;
    }
    iVar6 = iVar9;
    if (local_7d0.bSaveRawData == 0) goto LAB_001bbe52;
    if (local_7d0.szCfgFilePath[0] == '\0') {
      builtin_strncpy(local_238,"ms580314ba",0xb);
    }
    else {
      sprintf(local_238,"%.127s",local_7d0.szCfgFilePath);
    }
    sVar7 = strlen(local_238);
    iVar9 = (int)sVar7 + 1;
    uVar14 = sVar7 & 0xffffffff;
    do {
      if ((int)uVar14 < 1) goto LAB_001bbdd1;
      uVar1 = uVar14 - 1;
      iVar9 = iVar9 + -1;
      lVar5 = uVar14 - 1;
      uVar14 = uVar1;
    } while (local_238[lVar5] != '.');
    if ((uVar1 != 0) && (iVar9 <= (int)sVar7)) {
      memset(local_238 + (uVar1 & 0xffffffff),0,sVar7 - (uVar1 & 0xffffffff));
    }
LAB_001bbdd1:
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar13 = strtimeex_fns();
    sprintf(local_138,"log/%.127s_%.64s.csv",local_238,pcVar13);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    local_7d0.pfSaveFile = (FILE *)fopen(local_138,"w");
    if ((FILE *)local_7d0.pfSaveFile == (FILE *)0x0) {
      puts("Unable to create MS580314BA data file.");
      bVar4 = false;
      goto LAB_001bc24e;
    }
    fwrite("tv_sec;tv_usec;pressure;\n",0x19,1,(FILE *)local_7d0.pfSaveFile);
LAB_001bbe45:
    fflush((FILE *)local_7d0.pfSaveFile);
  }
LAB_001bbe52:
  bVar3 = true;
  bVar4 = false;
LAB_001bbe59:
  if (bExit != 0) goto LAB_001bc24e;
  goto LAB_001bb806;
LAB_001bc24e:
  if (local_840 == 0) {
    clock_gettime(4,(timespec *)&local_8f0);
    local_870 = local_8f0.inf;
    dStack_868 = local_8f0.sup;
    local_8f0.inf =
         (double)((((long)local_8f0.inf + (long)local_860) - local_880.tv_sec) +
                 ((long)local_8f0.sup + (long)dStack_858) / 1000000000);
    local_8f0.sup =
         (double)(((long)local_8f0.sup + (long)dStack_858) % 1000000000 - local_880.tv_nsec);
    if ((long)local_8f0.sup < 0) {
      local_8f0.inf = (double)((long)local_8f0.inf + ~((ulong)-(long)local_8f0.sup / 1000000000));
      local_8f0.sup =
           (double)((long)local_8f0.sup + 1000000000 +
                   ((ulong)-(long)local_8f0.sup / 1000000000) * 1000000000);
    }
    local_860 = local_8f0.inf;
    dStack_858 = local_8f0.sup;
  }
  if (local_888 == 0) {
    clock_gettime(4,(timespec *)&local_8f0);
    local_8b8 = local_8f0.inf;
    dStack_8b0 = local_8f0.sup;
    local_8f0.inf =
         (double)((((long)local_8f0.inf + (long)local_8a8) - local_8c8.tv_sec) +
                 ((long)local_8f0.sup + (long)dStack_8a0) / 1000000000);
    local_8f0.sup =
         (double)(((long)local_8f0.sup + (long)dStack_8a0) % 1000000000 - local_8c8.tv_nsec);
    if ((long)local_8f0.sup < 0) {
      local_8f0.inf = (double)((long)local_8f0.inf + ~((ulong)-(long)local_8f0.sup / 1000000000));
      local_8f0.sup =
           (double)((long)local_8f0.sup + 1000000000 +
                   ((ulong)-(long)local_8f0.sup / 1000000000) * 1000000000);
    }
    local_8a8 = local_8f0.inf;
    dStack_8a0 = local_8f0.sup;
  }
  if ((FILE *)local_7d0.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_7d0.pfSaveFile);
    local_7d0.pfSaveFile = (FILE *)0x0;
  }
  if (bVar4) goto LAB_001bc476;
  switch(local_7d0.RS232Port.DevType) {
  case 0:
    goto LAB_001bc456;
  case 1:
  case 3:
    SVar11 = local_7d0.RS232Port.s;
    break;
  case 2:
    shutdown(local_7d0.RS232Port.s,2);
    close(local_7d0.RS232Port.s);
  case 4:
    SVar11 = local_7d0.RS232Port.s_srv;
    break;
  default:
    goto switchD_001bc41e_default;
  }
  shutdown(SVar11,2);
  local_7d0.RS232Port.hDev._0_4_ = SVar11;
LAB_001bc456:
  iVar6 = close((int)local_7d0.RS232Port.hDev);
  if (iVar6 == 0) {
    pcVar13 = "MS580314BA disconnected.";
  }
  else {
switchD_001bc41e_default:
    pcVar13 = "MS580314BA disconnection failed.";
  }
  puts(pcVar13);
LAB_001bc476:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE MS580314BAThread(void* pParam)
{
	MS580314BA ms580314ba;
	struct timeval tv;
	double pressure = 0, pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ms580314ba, 0, sizeof(MS580314BA));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMS580314BA)
		{
			if (bConnected)
			{
				printf("MS580314BA Paused.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMS580314BA)
		{
			if (bConnected)
			{
				printf("Restarting a MS580314BA.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}
			bRestartMS580314BA = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMS580314BA(&ms580314ba, "MS580314BA0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ms580314ba.threadperiod;

				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (ms580314ba.pfSaveFile != NULL)
				{
					fclose(ms580314ba.pfSaveFile); 
					ms580314ba.pfSaveFile = NULL;
				}
				if ((ms580314ba.bSaveRawData)&&(ms580314ba.pfSaveFile == NULL)) 
				{
					if (strlen(ms580314ba.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ms580314ba.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ms580314ba");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ms580314ba.pfSaveFile = fopen(szSaveFilePath, "w");
					if (ms580314ba.pfSaveFile == NULL) 
					{
						printf("Unable to create MS580314BA data file.\n");
						break;
					}
					fprintf(ms580314ba.pfSaveFile, "tv_sec;tv_usec;pressure;\n"); 
					fflush(ms580314ba.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetPressureMS580314BA(&ms580314ba, &pressure) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(pressure-pressure_prev) < 0.05)
					{
						filteredpressure = pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, ms580314ba.PressureRef, ms580314ba.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);

				if (ms580314ba.bSaveRawData)
				{
					fprintf(ms580314ba.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, pressure);
					fflush(ms580314ba.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a MS580314BA lost.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}		
		}

		//printf("MS580314BAThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (ms580314ba.pfSaveFile != NULL)
	{
		fclose(ms580314ba.pfSaveFile); 
		ms580314ba.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMS580314BA(&ms580314ba);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}